

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O0

bool __thiscall MeCab::Connector::openText(Connector *this,char *filename)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  char *in_RSI;
  long in_RDI;
  scoped_fixed_array<char,_8192> buf;
  char *column [2];
  ifstream ifs;
  scoped_fixed_array<char,_8192> *in_stack_fffffffffffffd20;
  size_t in_stack_fffffffffffffd48;
  char **in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  die local_261;
  scoped_fixed_array<char,_8192> local_260;
  char *local_248;
  char *local_240;
  undefined4 local_230;
  long local_220 [65];
  char *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::ifstream::ifstream(local_220,in_RSI,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    scoped_fixed_array<char,_8192>::scoped_fixed_array(in_stack_fffffffffffffd20);
    pcVar3 = scoped_fixed_array<char,_8192>::get(&local_260);
    scoped_fixed_array<char,_8192>::size(&local_260);
    std::istream::getline((char *)local_220,(long)pcVar3);
    scoped_fixed_array<char,_8192>::get(&local_260);
    sVar4 = tokenize2<char**>(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                              in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    if (sVar4 != 2) {
      die::die(&local_261);
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                              );
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x39);
      poVar5 = std::operator<<(poVar5,") [");
      poVar5 = std::operator<<(poVar5,"tokenize2(buf.get(), \"\\t \", column, 2) == 2");
      poVar5 = std::operator<<(poVar5,"] ");
      poVar5 = std::operator<<(poVar5,"format error: ");
      pcVar3 = scoped_fixed_array<char,_8192>::get(&local_260);
      in_stack_fffffffffffffd20 = (scoped_fixed_array<char,_8192> *)std::operator<<(poVar5,pcVar3);
      die::operator&(&local_261,(ostream *)in_stack_fffffffffffffd20);
      die::~die((die *)0x1cf5c7);
    }
    iVar2 = atoi(local_248);
    *(short *)(in_RDI + 0x20) = (short)iVar2;
    iVar2 = atoi(local_240);
    *(short *)(in_RDI + 0x22) = (short)iVar2;
    local_1 = 1;
    local_230 = 1;
    scoped_fixed_array<char,_8192>::~scoped_fixed_array(in_stack_fffffffffffffd20);
  }
  else {
    poVar5 = std::operator<<((ostream *)(in_RDI + 0x28),"no such file or directory: ");
    std::operator<<(poVar5,local_18);
    local_1 = 0;
    local_230 = 1;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool Connector::openText(const char *filename) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    WHAT << "no such file or directory: " << filename;
    return false;
  }
  char *column[2];
  scoped_fixed_array<char, BUF_SIZE> buf;
  ifs.getline(buf.get(), buf.size());
  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();
  lsize_ = std::atoi(column[0]);
  rsize_ = std::atoi(column[1]);
  return true;
}